

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O2

void __thiscall
t_ocaml_generator::generate_serialize_map_element
          (t_ocaml_generator *this,ostream *out,t_map *tmap,string *kiter,string *viter)

{
  t_type *ptVar1;
  t_field vfield;
  t_field kfield;
  allocator local_211;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  t_field local_190;
  t_field local_e0;
  
  ptVar1 = tmap->key_type_;
  std::__cxx11::string::string((string *)&local_1b0,(string *)kiter);
  t_field::t_field(&local_e0,ptVar1,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string((string *)&local_1d0,"",(allocator *)&local_190);
  generate_serialize_field(this,out,&local_e0,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  ptVar1 = tmap->val_type_;
  std::__cxx11::string::string((string *)&local_1f0,(string *)viter);
  t_field::t_field(&local_190,ptVar1,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::string((string *)&local_210,"",&local_211);
  generate_serialize_field(this,out,&local_190,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  t_field::~t_field(&local_190);
  t_field::~t_field(&local_e0);
  return;
}

Assistant:

void t_ocaml_generator::generate_serialize_map_element(ostream& out,
                                                       t_map* tmap,
                                                       string kiter,
                                                       string viter) {
  t_field kfield(tmap->get_key_type(), kiter);
  generate_serialize_field(out, &kfield);

  t_field vfield(tmap->get_val_type(), viter);
  generate_serialize_field(out, &vfield);
}